

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

short __thiscall
duckdb::WindowQuantileState<short>::WindowScalar<short,true>
          (WindowQuantileState<short> *this,CursorType *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  bool bVar1;
  pointer this_00;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  string *msg;
  long in_RDI;
  IndexError *idx_err;
  array<short,_2UL> dest;
  Interpolator<true> interp;
  short *in_stack_fffffffffffffee8;
  Interpolator<true> *in_stack_fffffffffffffef0;
  allocator *this_01;
  undefined4 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  undefined2 in_stack_fffffffffffffefe;
  short sVar5;
  Interpolator<true> *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
  *in_stack_ffffffffffffff10;
  undefined6 in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2e;
  Vector *in_stack_ffffffffffffff30;
  idx_t in_stack_ffffffffffffff38;
  SubFrames *in_stack_ffffffffffffff40;
  QuantileCursor<short> *in_stack_ffffffffffffff48;
  QuantileSortTree *in_stack_ffffffffffffff50;
  allocator local_99;
  string local_98 [150];
  short local_2;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
                      *)0x1cfece9);
  if (bVar1) {
    unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>::
    operator->((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
                *)in_stack_fffffffffffffef0);
    local_2 = QuantileSortTree::WindowScalar<short,short,true>
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                         in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         in_stack_ffffffffffffff30,
                         (QuantileValue *)
                         CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28));
  }
  else {
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>_>
                        *)0x1cfed44);
    if (!bVar1) {
      msg = (string *)__cxa_allocate_exception(0x10);
      this_01 = &local_99;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_98,"No accelerator for scalar QUANTILE",this_01);
      InternalException::InternalException((InternalException *)this_01,msg);
      __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
    }
    this_00 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>,_true>
              ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>,_true>
                            *)in_stack_fffffffffffffef0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>::
    size(this_00);
    Interpolator<true>::Interpolator
              (in_stack_ffffffffffffff00,
               (QuantileValue *)
               CONCAT26(in_stack_fffffffffffffefe,
                        CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
               (idx_t)in_stack_fffffffffffffef0,SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
    unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>,_true>
    ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>,_true>
                  *)in_stack_fffffffffffffef0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>::
    at(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00,
       (vector<std::pair<unsigned_long,_short>,_std::allocator<std::pair<unsigned_long,_short>_>_> *
       )CONCAT26(in_stack_fffffffffffffefe,
                 CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
    pvVar2 = vector<std::pair<unsigned_long,_short>,_true>::operator[]
                       ((vector<std::pair<unsigned_long,_short>,_true> *)in_stack_fffffffffffffef0,
                        (size_type)in_stack_fffffffffffffee8);
    sVar5 = pvVar2->second;
    pvVar3 = ::std::array<short,_2UL>::operator[]
                       ((array<short,_2UL> *)in_stack_fffffffffffffef0,
                        (size_type)in_stack_fffffffffffffee8);
    *pvVar3 = sVar5;
    sVar4 = ::std::
            vector<std::pair<unsigned_long,_short>,_std::allocator<std::pair<unsigned_long,_short>_>_>
            ::size((vector<std::pair<unsigned_long,_short>,_std::allocator<std::pair<unsigned_long,_short>_>_>
                    *)(in_RDI + 0x28));
    if (sVar4 < 2) {
      pvVar2 = vector<std::pair<unsigned_long,_short>,_true>::operator[]
                         ((vector<std::pair<unsigned_long,_short>,_true> *)in_stack_fffffffffffffef0
                          ,(size_type)in_stack_fffffffffffffee8);
      sVar5 = pvVar2->second;
      pvVar3 = ::std::array<short,_2UL>::operator[]
                         ((array<short,_2UL> *)in_stack_fffffffffffffef0,
                          (size_type)in_stack_fffffffffffffee8);
      *pvVar3 = sVar5;
    }
    else {
      pvVar2 = vector<std::pair<unsigned_long,_short>,_true>::operator[]
                         ((vector<std::pair<unsigned_long,_short>,_true> *)in_stack_fffffffffffffef0
                          ,(size_type)in_stack_fffffffffffffee8);
      sVar5 = pvVar2->second;
      pvVar3 = ::std::array<short,_2UL>::operator[]
                         ((array<short,_2UL> *)in_stack_fffffffffffffef0,
                          (size_type)in_stack_fffffffffffffee8);
      *pvVar3 = sVar5;
    }
    ::std::array<short,_2UL>::data((array<short,_2UL> *)0x1cfef52);
    local_2 = Interpolator<true>::Extract<short,short>
                        (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(Vector *)0x1cfef6a);
  }
  return local_2;
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}